

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O3

Shader * vera::getFillShader(void)

{
  Shader *this;
  DefaultShaders _type;
  DefaultShaders _type_00;
  string local_50;
  string local_30;
  
  if (fill_shader == (Shader *)0x0) {
    this = (Shader *)operator_new(0x100);
    Shader::Shader(this);
    fill_shader = this;
    getDefaultSrc_abi_cxx11_(&local_30,(vera *)0xf,_type);
    getDefaultSrc_abi_cxx11_(&local_50,(vera *)0xe,_type_00);
    Shader::setSource(this,&local_30,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return fill_shader;
}

Assistant:

Shader* getFillShader() {
    if (fill_shader == nullptr) {
        fill_shader = new Shader();
        fill_shader->setSource( getDefaultSrc(FRAG_FILL), getDefaultSrc(VERT_FILL) );
    }
    
    return fill_shader;
}